

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

Gls_Man_t * Gls_ManAlloc(Vec_Str_t *vLines,int *pCounts)

{
  Gls_Man_t *pGVar1;
  Vec_Str_t *pVVar2;
  char *__s;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  Vec_Wec_t *pVVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t __n;
  
  pGVar1 = (Gls_Man_t *)calloc(1,0x88);
  pGVar1->vLines = vLines;
  iVar8 = vLines->nSize;
  __n = (long)iVar8 + 100;
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  iVar10 = (int)__n;
  iVar9 = 0x10;
  if (0xe < iVar8 + 99U) {
    iVar9 = iVar10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar9);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar10;
  piVar4 = (int *)0x0;
  memset(__s,0,__n);
  pGVar1->vTypes = pVVar2;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 != 0) {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar10;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,__n * 4);
  }
  pGVar1->vIndexes = pVVar3;
  iVar9 = pCounts[7];
  iVar8 = iVar9 * 4;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if (iVar9 * 4 - 1U < 0xf) {
    iVar8 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vLut4s = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vLut4TTs = pVVar3;
  iVar8 = pCounts[8];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = iVar8 * 6;
  if (iVar8 * 6 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vLut6s = pVVar3;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    pwVar6 = (word *)0x0;
  }
  else {
    pwVar6 = (word *)malloc((long)iVar9 << 3);
  }
  pVVar5->pArray = pwVar6;
  pGVar1->vLut6TTs = pVVar5;
  iVar8 = pCounts[9];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = iVar8 * 5;
  if (iVar8 * 5 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vBoxes = pVVar3;
  iVar9 = pCounts[10];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar10 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 * 4);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vDelays = pVVar3;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  if (iVar9 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar7->pArray = pVVar3;
  pGVar1->vDelayIns = pVVar7;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar7->pArray = pVVar3;
  pGVar1->vDelayOuts = pVVar7;
  iVar9 = pCounts[2];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if (iVar9 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderPis = pVVar3;
  iVar9 = pCounts[3];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar11 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderPos = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderBoxes = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderDelays = pVVar3;
  iVar9 = pCounts[4];
  iVar10 = pCounts[8];
  iVar11 = pCounts[7];
  iVar8 = iVar10 + iVar11 + iVar9 * 2;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  if ((iVar10 + iVar11 + iVar9 * 2) - 1U < 0xf) {
    iVar8 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderLuts = pVVar3;
  iVar8 = pCounts[5];
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar4;
  pGVar1->vOrderSeqs = pVVar3;
  return pGVar1;
}

Assistant:

Gls_Man_t * Gls_ManAlloc( Vec_Str_t * vLines, int * pCounts )
{
    Gls_Man_t * p = ABC_CALLOC( Gls_Man_t, 1 );
    p->vLines     = vLines;
    p->vTypes     = Vec_StrStart( Vec_StrSize(vLines)+100 ); 
    p->vIndexes   = Vec_IntStart( Vec_StrSize(vLines)+100 ); 
    p->vLut4s     = Vec_IntAlloc( 4 * pCounts[GLS_LUT4] );
    p->vLut4TTs   = Vec_IntAlloc( pCounts[GLS_LUT4] );
    p->vLut6s     = Vec_IntAlloc( 6 * pCounts[GLS_LUT6] );
    p->vLut6TTs   = Vec_WrdAlloc( pCounts[GLS_LUT6] );
    p->vBoxes     = Vec_IntAlloc( 5 * pCounts[GLS_BOX] );
    p->vDelays    = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vDelayIns  = Vec_WecAlloc( pCounts[GLS_DEL] );
    p->vDelayOuts = Vec_WecAlloc( pCounts[GLS_DEL] );
    // ordering
    p->vOrderPis    = Vec_IntAlloc( pCounts[GLS_PI] );
    p->vOrderPos    = Vec_IntAlloc( pCounts[GLS_PO] );
    p->vOrderBoxes  = Vec_IntAlloc( pCounts[GLS_BOX] );
    p->vOrderDelays = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vOrderLuts   = Vec_IntAlloc( pCounts[GLS_LUT4] + pCounts[GLS_LUT6] + 2*pCounts[GLS_BAR] );
    p->vOrderSeqs   = Vec_IntAlloc( pCounts[GLS_SEQ] );
    return p;
}